

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

void __thiscall docopt::value::throwIfNotKind(value *this,Kind expected)

{
  runtime_error *this_00;
  string local_48 [8];
  string error;
  
  if (this->kind == expected) {
    return;
  }
  std::__cxx11::string::string
            (local_48,"Illegal cast to ",(allocator *)(error.field_2._M_local_buf + 0xf));
  kindAsString(expected);
  std::__cxx11::string::append((char *)local_48);
  std::__cxx11::string::append((char *)local_48);
  kindAsString(this->kind);
  std::__cxx11::string::append((char *)local_48);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwIfNotKind(Kind expected) const {
			if (kind == expected)
				return;

			std::string error = "Illegal cast to ";
			error += kindAsString(expected);
			error += "; type is actually ";
			error += kindAsString(kind);
			throw std::runtime_error(std::move(error));
		}